

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings_manager.cc
# Opt level: O2

void __thiscall xsettingsd::SettingsManager::DestroyWindows(SettingsManager *this)

{
  pointer puVar1;
  pointer puVar2;
  
  if (this->display_ != (Display *)0x0) {
    for (puVar2 = (this->windows_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        puVar2 != (this->windows_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                  ._M_impl.super__Vector_impl_data._M_finish; puVar2 = puVar2 + 1) {
      XDestroyWindow(this->display_,*puVar2);
    }
    puVar1 = (this->windows_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (puVar2 != puVar1) {
      (this->windows_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar1;
    }
    return;
  }
  __assert_fail("display_",
                "/workspace/llm4binary/github/license_c_cmakelists/derat[P]xsettingsd/settings_manager.cc"
                ,0xaa,"void xsettingsd::SettingsManager::DestroyWindows()");
}

Assistant:

void SettingsManager::DestroyWindows() {
  assert(display_);
  for (vector<Window>::iterator it = windows_.begin();
       it != windows_.end(); ++it) {
    XDestroyWindow(display_, *it);
  }
  windows_.clear();
}